

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  long lVar1;
  ImDrawList *this;
  ImVec2 IVar2;
  ImDrawIdx *pIVar3;
  ImDrawVert *pIVar4;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImGuiContext *pIVar5;
  undefined1 auVar6 [16];
  ImU32 IVar7;
  ImVec2 *out_r;
  uint uVar8;
  ImU32 col_upr_right;
  ImU32 IVar9;
  int iVar10;
  undefined7 uVar12;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  char *text_end;
  void *pvVar11;
  undefined7 extraout_var;
  int iVar13;
  byte bVar14;
  char cVar15;
  ImVec2 *pIVar16;
  long lVar17;
  uint uVar18;
  ImGuiContext *g;
  char *text;
  bool bVar19;
  uint uVar20;
  float fVar21;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ImVec2 IVar22;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  float fVar23;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  float fVar24;
  undefined4 extraout_XMM0_Dd_01;
  undefined8 extraout_XMM0_Qb;
  ImVec2 p_max_01;
  ImVec2 p_max_02;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  float fVar25;
  float S;
  float V;
  ImVec2 picker_pos;
  ImVec2 wheel_center;
  float B;
  float G;
  float R;
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  ImU32 col_hues [7];
  float vv;
  ImVec2 sv_cursor_pos;
  ImVec2 tra;
  ImVec4 hue_color_f;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  float local_248;
  float local_244;
  uint local_240;
  float local_23c;
  ImGuiContext *local_238;
  uint local_230;
  uint local_22c;
  ImVec2 local_228;
  float local_21c;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  ImVec2 local_1fc;
  ImU32 local_1f4;
  ImVec2 *local_1f0;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  ImU32 local_19c;
  ImU32 local_198;
  uint local_194;
  ImVec2 local_190;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec2 local_178;
  float local_170;
  float local_16c;
  int local_168;
  int local_164;
  float local_160;
  undefined1 local_158 [12];
  float fStack_14c;
  float local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  ImVec2 local_138;
  float fStack_130;
  float fStack_12c;
  undefined4 uStack_128;
  uint uStack_124;
  ImVec2 local_120;
  undefined1 local_118 [16];
  ImGuiWindow *local_100;
  ImVec2 local_f8;
  ImU32 local_ec;
  ImVec4 local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  size_t local_b8;
  ulong local_b0;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  local_1d8._8_8_ = local_1d8._0_8_;
  local_100 = GImGui->CurrentWindow;
  local_100->WriteAccessed = true;
  if (local_100->SkipItems != false) {
    bVar14 = 0;
    goto LAB_0016b80f;
  }
  this = local_100->DrawList;
  local_218._0_4_ = CalcItemWidth();
  local_218._4_4_ = extraout_XMM0_Db;
  uStack_210._0_4_ = extraout_XMM0_Dc;
  uStack_210._4_4_ = extraout_XMM0_Dd;
  local_238 = pIVar5;
  (pIVar5->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar18 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar18);
  }
  pIVar5 = local_238;
  if ((flags & 0x6000000U) == 0) {
    uVar8 = local_238->ColorEditOptions & 0x6000000;
    uVar20 = 0x2000000;
    if (uVar8 != 0) {
      uVar20 = uVar8;
    }
    uVar18 = uVar18 | uVar20;
  }
  if ((uVar18 & 0x18000000) == 0) {
    uVar8 = local_238->ColorEditOptions & 0x18000000;
    uVar20 = 0x8000000;
    if (uVar8 != 0) {
      uVar20 = uVar8;
    }
    uVar18 = uVar18 | uVar20;
  }
  uVar20 = (uVar18 & 0x6000000) - 1;
  if ((uVar18 & 0x6000000 ^ uVar20) <= uVar20) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x130c,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  local_1d8._0_8_ = label;
  uVar20 = (uVar18 & 0x18000000) - 1;
  if ((uVar18 & 0x18000000 ^ uVar20) <= uVar20) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x130d,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar18 & 8) == 0) {
    uVar18 = uVar18 | local_238->ColorEditOptions & 0x10000U;
  }
  local_194 = uVar18 & 0x10002;
  bVar19 = local_194 == 0x10000;
  local_228 = (local_100->DC).CursorPos;
  local_1f0 = (ImVec2 *)col;
  local_148 = GetFrameHeight();
  pIVar16 = local_1f0;
  fVar21 = (pIVar5->Style).ItemInnerSpacing.x;
  local_118 = ZEXT416((uint)fVar21);
  fVar25 = (float)local_218._0_4_ - (local_148 + fVar21) * (float)(byte)(bVar19 + 1);
  uVar20 = -(uint)(fVar25 <= local_148);
  uStack_1b4 = local_218._4_4_ & extraout_XMM0_Db_00;
  uStack_1b0 = (uint)uStack_210 & extraout_XMM0_Dc_00;
  uStack_1ac = uStack_210._4_4_ & extraout_XMM0_Dd_00;
  local_1b8 = (float)(uVar20 & (uint)local_148 | ~uVar20 & (uint)fVar25);
  local_218._0_4_ = local_228.x;
  _local_1c8 = ZEXT416((uint)(local_228.x + local_1b8 + fVar21));
  local_b8 = (ulong)((uVar18 & 2) == 0) * 4 + 0xc;
  uStack_144 = extraout_XMM0_Db_00;
  uStack_140 = extraout_XMM0_Dc_00;
  uStack_13c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_1f0,local_b8);
  local_21c = local_1b8 * 0.08;
  local_a8 = local_1b8 * 0.5;
  local_1fc.x = (local_148 + local_1b8) * 0.5 + (float)local_218._0_4_;
  uStack_a4 = uStack_1b4;
  uStack_a0 = uStack_1b0;
  uStack_9c = uStack_1ac;
  local_1fc.y = local_228.y + local_a8;
  local_218._4_4_ = uStack_1b4;
  local_218._0_4_ = local_a8 - local_21c;
  uStack_210._0_4_ = uStack_1b0;
  uStack_210._4_4_ = uStack_1ac;
  local_180.x = (local_a8 - local_21c) - (float)(int)(local_1b8 * 0.027);
  local_180.y = 0.0;
  local_190.x = local_180.x * -0.5;
  local_188.y = local_180.x * -0.866025;
  local_190.y = local_180.x * 0.866025;
  local_248 = pIVar16->x;
  local_244 = pIVar16->y;
  local_23c = pIVar16[1].x;
  local_1e4 = local_23c;
  local_1e0 = local_244;
  local_1dc = local_248;
  local_188.x = local_190.x;
  if ((uVar18 >> 0x1b & 1) == 0) {
    text = (char *)local_1d8._0_8_;
    if ((uVar18 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_248,local_244,local_23c,&local_1dc,&local_1e0,&local_1e4);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_248,local_244,local_23c,&local_248,&local_244,&local_23c);
    IVar22.x = pIVar5->ColorEditLastColor[0];
    IVar22.y = pIVar5->ColorEditLastColor[1];
    text = (char *)local_1d8._0_8_;
    if (pIVar5->ColorEditLastColor[2] == pIVar16[1].x && IVar22 == *pIVar16) {
      if ((local_244 == 0.0) && (!NAN(local_244))) {
        local_248 = local_238->ColorEditLastHue;
      }
      if ((local_23c == 0.0) && (!NAN(local_23c))) {
        local_244 = local_238->ColorEditLastSat;
      }
    }
  }
  local_1d8._4_4_ = uStack_144;
  local_1d8._0_4_ = local_148 + (float)local_1c8._0_4_;
  local_1d8._8_4_ = uStack_140;
  local_1d8._12_4_ = uStack_13c;
  PushItemFlag(8,true);
  if ((uVar18 >> 0x1a & 1) == 0) {
    if ((uVar18 >> 0x19 & 1) == 0) {
      local_22c = 0;
      local_230 = 0;
      local_240 = 0;
    }
    else {
      local_178.y = local_1b8;
      local_178.x = local_1b8;
      local_22c = 0;
      InvisibleButton("sv",&local_178,0);
      bVar19 = IsItemActive();
      if (bVar19) {
        fVar21 = ((local_238->IO).MousePos.x - local_228.x) / (local_1b8 + -1.0);
        local_244 = 1.0;
        if (fVar21 <= 1.0) {
          local_244 = fVar21;
        }
        local_244 = (float)(~-(uint)(fVar21 < 0.0) & (uint)local_244);
        fVar25 = ((local_238->IO).MousePos.y - local_228.y) / (local_1b8 + -1.0);
        fVar21 = 1.0;
        if (fVar25 <= 1.0) {
          fVar21 = fVar25;
        }
        local_23c = (float)(-(uint)(fVar25 < 0.0) & 0x3f800000 |
                           ~-(uint)(fVar25 < 0.0) & (uint)(1.0 - fVar21));
        local_22c = (uint)CONCAT71((int7)((ulong)local_238 >> 8),1);
      }
      if ((uVar18 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_178.y = local_228.y;
      local_178.x = (float)local_1c8._0_4_;
      SetCursorScreenPos(&local_178);
      local_178.y = local_1b8;
      local_178.x = local_148;
      local_230 = 0;
      InvisibleButton("hue",&local_178,0);
      bVar19 = IsItemActive();
      local_240 = local_22c;
      if (bVar19) {
        fVar21 = ((local_238->IO).MousePos.y - local_228.y) / (local_1b8 + -1.0);
        local_248 = 1.0;
        if (fVar21 <= 1.0) {
          local_248 = fVar21;
        }
        local_248 = (float)(~-(uint)(fVar21 < 0.0) & (uint)local_248);
        uVar12 = (undefined7)((ulong)local_238 >> 8);
        local_230 = (uint)CONCAT71(uVar12,1);
        local_240 = (uint)CONCAT71(uVar12,1);
      }
    }
  }
  else {
    local_178.y = local_1b8;
    local_178.x = (local_238->Style).ItemInnerSpacing.x + local_1b8 + local_148;
    local_22c = 0;
    InvisibleButton("hsv",&local_178,0);
    bVar19 = IsItemActive();
    local_230 = 0;
    local_240 = 0;
    if (bVar19) {
      fVar25 = (local_238->IO).MouseClickedPos[0].x - local_1fc.x;
      local_c8 = ZEXT416((uint)fVar25);
      fVar23 = (local_238->IO).MouseClickedPos[0].y - local_1fc.y;
      fVar21 = (local_238->IO).MousePos.x - local_1fc.x;
      local_88 = ZEXT416((uint)fVar21);
      local_98 = (local_238->IO).MousePos.y - local_1fc.y;
      fVar25 = fVar25 * fVar25 + fVar23 * fVar23;
      local_d8._0_4_ = fVar23;
      if ((fVar25 < ((float)local_218._0_4_ + -1.0) * ((float)local_218._0_4_ + -1.0)) ||
         ((local_a8 + 1.0) * (local_a8 + 1.0) < fVar25)) {
        local_230 = 0;
      }
      else {
        fVar21 = atan2f(local_98,fVar21);
        fVar21 = (fVar21 / 3.1415927) * 0.5;
        local_248 = (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar21 |
                           (uint)(fVar21 + 1.0) & -(uint)(fVar21 < 0.0));
        local_230 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_138.x = cosf(local_248 * -2.0 * 3.1415927);
      fVar21 = sinf(local_248 * -2.0 * 3.1415927);
      local_178.x = (float)local_c8._0_4_ * local_138.x - fVar21 * (float)local_d8._0_4_;
      fVar25 = (float)local_d8._0_4_ * local_138.x;
      local_d8._0_4_ = fVar21;
      local_178.y = (float)local_c8._0_4_ * fVar21 + fVar25;
      bVar19 = ImTriangleContainsPoint(&local_180,&local_188,&local_190,&local_178);
      if (bVar19) {
        local_178.x = (float)local_88._0_4_ * local_138.x - (float)local_d8._0_4_ * local_98;
        local_178.y = (float)local_88._0_4_ * (float)local_d8._0_4_ + local_98 * local_138.x;
        bVar19 = ImTriangleContainsPoint(&local_180,&local_188,&local_190,&local_178);
        if (!bVar19) {
          local_178 = ImTriangleClosestPoint(&local_180,&local_188,&local_190,&local_178);
        }
        ImTriangleBarycentricCoords
                  (&local_180,&local_188,&local_190,&local_178,&local_e8.x,(float *)local_158,
                   &local_120.x);
        fVar25 = 1.0 - (float)local_158._0_4_;
        fVar21 = 1.0;
        if (fVar25 <= 1.0) {
          fVar21 = fVar25;
        }
        local_23c = (float)(-(uint)(fVar25 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar25 < 0.0001) & (uint)fVar21);
        fVar25 = local_e8.x / local_23c;
        fVar21 = 1.0;
        if (fVar25 <= 1.0) {
          fVar21 = fVar25;
        }
        local_244 = (float)(-(uint)(fVar25 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar25 < 0.0001) & (uint)fVar21);
        uVar12 = (undefined7)((ulong)extraout_RAX_00 >> 8);
        local_22c = (uint)CONCAT71(uVar12,1);
        local_240 = (uint)CONCAT71(uVar12,1);
        pIVar16 = local_1f0;
      }
      else {
        local_22c = 0;
        local_240 = local_230;
      }
    }
    if ((uVar18 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_118._0_4_ = (float)local_118._0_4_ + (float)local_1d8._0_4_;
  if (local_194 == 0x10000) {
    local_178.y = local_228.y;
    local_178.x = (float)local_118._0_4_;
    SetCursorScreenPos(&local_178);
    local_178.y = local_1b8;
    local_178.x = local_148;
    InvisibleButton("alpha",&local_178,0);
    bVar19 = IsItemActive();
    if (bVar19) {
      fVar25 = ((local_238->IO).MousePos.y - local_228.y) / (local_1b8 + -1.0);
      fVar21 = 1.0;
      if (fVar25 <= 1.0) {
        fVar21 = fVar25;
      }
      pIVar16[1].y = (float)(-(uint)(fVar25 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar25 < 0.0) & (uint)(1.0 - fVar21));
      local_240 = (uint)CONCAT71((int7)((ulong)local_238 >> 8),1);
    }
  }
  PopItemFlag();
  if ((uVar18 >> 8 & 1) == 0) {
    SameLine(0.0,(local_238->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar18) && (text_end = FindRenderedTextEnd(text,(char *)0x0), text_end != text)) {
    if ((uVar18 >> 8 & 1) != 0) {
      SameLine(0.0,(local_238->Style).ItemInnerSpacing.x);
    }
    TextEx(text,text_end,0);
  }
  if ((uVar18 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_178 = *pIVar16;
    local_170 = pIVar16[1].x;
    if ((uVar18 & 2) == 0) {
      local_16c = pIVar16[1].y;
    }
    else {
      local_16c = 1.0;
    }
    if ((char)uVar18 < '\0') {
      Text("Current");
    }
    local_138.x = local_148 * 3.0;
    local_138.y = local_148 + local_148;
    uStack_128 = 0;
    uStack_124 = uStack_144;
    ColorButton("##current",(ImVec4 *)&local_178,uVar18 & 0x180e0040,local_138);
    if (ref_col != (float *)0x0) {
      Text("Original");
      local_e8.x = ref_col[0];
      local_e8.y = ref_col[1];
      local_e8.z = ref_col[2];
      if ((uVar18 & 2) == 0) {
        local_e8.w = ref_col[3];
      }
      else {
        local_e8.w = 1.0;
      }
      bVar19 = ColorButton("##original",&local_e8,uVar18 & 0x180e0040,local_138);
      if (bVar19) {
        pvVar11 = memcpy(pIVar16,ref_col,local_b8);
        local_240 = (uint)CONCAT71((int7)((ulong)pvVar11 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  if (((char)local_230 != '\0') || ((char)local_22c != '\0')) {
    if ((uVar18 >> 0x1b & 1) == 0) {
      if ((uVar18 >> 0x1c & 1) != 0) {
        pIVar16->x = local_248;
        pIVar16->y = local_244;
        pIVar16[1].x = local_23c;
      }
    }
    else {
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_248) & (uint)local_248 |
                        (uint)(local_248 + -1e-05) & -(uint)(1.0 <= local_248)),
                 (float)(~-(uint)(0.0 < local_244) & 0x3727c5ac |
                        (uint)local_244 & -(uint)(0.0 < local_244)),
                 (float)(~-(uint)(0.0 < local_23c) & 0x358637bd |
                        (uint)local_23c & -(uint)(0.0 < local_23c)),&pIVar16->x,&pIVar16->y,
                 &pIVar16[1].x);
      local_238->ColorEditLastHue = local_248;
      local_238->ColorEditLastSat = local_244;
      fVar21 = pIVar16->y;
      local_238->ColorEditLastColor[0] = pIVar16->x;
      local_238->ColorEditLastColor[1] = fVar21;
      local_238->ColorEditLastColor[2] = pIVar16[1].x;
    }
  }
  cVar15 = '\x01';
  fVar21 = local_148 * 0.2;
  fVar25 = 0.0;
  fVar23 = 0.0;
  fVar24 = 0.0;
  if ((uVar18 & 0x20) == 0) {
    local_138.y = 0.0;
    local_138.x = local_148 * 0.2;
    fStack_130 = 0.0;
    fStack_12c = 0.0;
    fVar21 = (float)local_118._0_4_;
    if (local_194 != 0x10000) {
      fVar21 = (float)local_1c8._0_4_;
    }
    PushItemWidth((fVar21 + local_148) - local_228.x);
    uVar20 = uVar18 & 0x198e001a;
    cVar15 = '\x01';
    if (((uVar18 >> 0x14 & 1) != 0 || (uVar18 & 0x600000) == 0) &&
       (bVar19 = ColorEdit4("##rgb",&local_1f0->x,uVar20 | 0x100004), bVar19)) {
      local_240 = (uint)CONCAT71(extraout_var,1);
      if (local_238->ActiveId == 0) {
        cVar15 = '\x01';
      }
      else {
        cVar15 = local_238->ActiveIdAllowOverlap;
      }
    }
    if ((uVar18 >> 0x15 & 1) != 0 || (uVar18 & 0x500000) == 0) {
      bVar19 = ColorEdit4("##hsv",&local_1f0->x,uVar20 | 0x200004);
      local_240 = CONCAT31((int3)(local_240 >> 8),(byte)local_240 | bVar19);
    }
    if ((uVar18 >> 0x16 & 1) != 0 || (uVar18 & 0x300000) == 0) {
      bVar19 = ColorEdit4("##hex",&local_1f0->x,uVar20 | 0x400004);
      local_240 = CONCAT31((int3)(local_240 >> 8),(byte)local_240 | bVar19);
    }
    PopItemWidth();
    fVar21 = local_138.x;
    fVar25 = local_138.y;
    fVar23 = fStack_130;
    fVar24 = fStack_12c;
  }
  out_r = local_1f0;
  fVar21 = (float)(int)fVar21;
  fVar25 = (float)(int)fVar25;
  fVar23 = (float)(int)fVar23;
  fVar24 = (float)(int)fVar24;
  if (((uVar18 >> 0x1b & 1) != 0) && (cVar15 == '\0')) {
    local_138.y = fVar25;
    local_138.x = fVar21;
    fStack_130 = fVar23;
    fStack_12c = fVar24;
    ColorConvertRGBtoHSV
              (local_1f0->x,local_1f0->y,local_1f0[1].x,&local_178.x,&local_e8.x,(float *)local_158)
    ;
    if ((local_178.x <= 0.0) && (0.0 < local_248)) {
      if (0.0 < (float)local_158._0_4_) {
LAB_0016a946:
        if (0.0 < local_e8.x) goto LAB_0016a96c;
        fVar21 = local_244 * 0.5;
      }
      else {
        if ((local_23c == (float)local_158._0_4_) &&
           (!NAN(local_23c) && !NAN((float)local_158._0_4_))) goto LAB_0016a946;
        local_158._0_4_ = local_23c * 0.5;
        fVar21 = local_244;
      }
      ColorConvertHSVtoRGB
                (local_248,fVar21,(float)local_158._0_4_,&out_r->x,&pIVar16->y,&pIVar16[1].x);
    }
LAB_0016a96c:
    fVar21 = local_138.x;
    fVar25 = local_138.y;
    fVar23 = fStack_130;
    fVar24 = fStack_12c;
  }
  pIVar16 = local_1f0;
  uVar20 = local_240;
  local_78 = (float)(int)fVar21;
  fStack_74 = (float)(int)fVar25;
  fStack_70 = (float)(int)fVar23;
  fStack_6c = (float)(int)fVar24;
  if ((char)local_240 != '\0') {
    if ((uVar18 >> 0x1b & 1) == 0) {
      if ((uVar18 >> 0x1c & 1) != 0) {
        local_248 = local_1f0->x;
        local_244 = local_1f0->y;
        local_23c = local_1f0[1].x;
        ColorConvertHSVtoRGB(local_248,local_244,local_23c,&local_1dc,&local_1e0,&local_1e4);
      }
    }
    else {
      local_1dc = local_1f0->x;
      local_1e0 = local_1f0->y;
      local_1e4 = local_1f0[1].x;
      ColorConvertRGBtoHSV(local_1dc,local_1e0,local_1e4,&local_248,&local_244,&local_23c);
      IVar2.x = local_238->ColorEditLastColor[0];
      IVar2.y = local_238->ColorEditLastColor[1];
      if (local_238->ColorEditLastColor[2] == pIVar16[1].x && IVar2 == *pIVar16) {
        if ((local_244 == 0.0) && (!NAN(local_244))) {
          local_248 = local_238->ColorEditLastHue;
        }
        if ((local_23c == 0.0) && (!NAN(local_23c))) {
          local_244 = local_238->ColorEditLastSat;
        }
      }
    }
  }
  pIVar5 = local_238;
  local_e8.w = (local_238->Style).Alpha;
  fVar21 = 1.0;
  if (local_e8.w <= 1.0) {
    fVar21 = local_e8.w;
  }
  local_e8.x = 1.0;
  local_e8.y = 1.0;
  local_e8.z = 1.0;
  uVar8 = (int)((float)(~-(uint)(local_e8.w < 0.0) & (uint)fVar21) * 255.0 + 0.5) * 0x1000000;
  local_b0 = (ulong)uVar8;
  local_168 = uVar8 + 0xff0000;
  local_16c = (float)(uVar8 + 0xffff00);
  local_1f4 = uVar8 + 0xffffff;
  local_160 = (float)(uVar8 + 0xff);
  local_178.y = (float)(uVar8 + 0xffff);
  local_178.x = local_160;
  local_170 = (float)(uVar8 + 0xff00);
  local_198 = uVar8 + 0x808080;
  local_164 = uVar8 + 0xff00ff;
  ColorConvertHSVtoRGB(local_248,1.0,1.0,&local_e8.x,&local_e8.y,&local_e8.z);
  col_upr_right = ColorConvertFloat4ToU32(&local_e8);
  fStack_14c = (pIVar5->Style).Alpha;
  local_158._4_4_ = local_1e0;
  local_158._0_4_ = local_1dc;
  local_158._8_4_ = local_1e4;
  IVar9 = ColorConvertFloat4ToU32((ImVec4 *)local_158);
  IVar7 = local_1f4;
  local_120.x = 0.0;
  local_120.y = 0.0;
  if ((uVar18 >> 0x1a & 1) == 0) {
    if ((uVar18 >> 0x19 & 1) != 0) {
      local_158._0_4_ = local_228.x + local_1b8;
      local_158._4_4_ = local_228.y + local_1b8;
      local_19c = IVar9;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_228,(ImVec2 *)local_158,local_1f4,col_upr_right,col_upr_right,local_1f4
                );
      local_158._0_4_ = local_228.x + local_1b8;
      local_158._4_4_ = local_228.y + local_1b8;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_228,(ImVec2 *)local_158,0,0,(ImU32)local_b0,(ImU32)local_b0);
      p_max_01.x = local_228.x + local_1b8;
      p_max_01.y = local_228.y + local_1b8;
      RenderFrameBorder(local_228,p_max_01,0.0);
      fVar21 = 1.0;
      if (local_244 <= 1.0) {
        fVar21 = local_244;
      }
      fVar25 = (float)(int)((float)(~-(uint)(local_244 < 0.0) & (uint)fVar21) * local_1b8 +
                            local_228.x + 0.5);
      fVar21 = local_1b8 + local_228.x + -2.0;
      if (fVar25 <= fVar21) {
        fVar21 = fVar25;
      }
      uVar18 = -(uint)(fVar25 < local_228.x + 2.0);
      fVar23 = 1.0 - local_23c;
      fVar25 = 1.0;
      if (fVar23 <= 1.0) {
        fVar25 = fVar23;
      }
      fVar23 = (float)(int)((float)(~-(uint)(fVar23 < 0.0) & (uint)fVar25) * local_1b8 + local_228.y
                           + 0.5);
      fVar25 = local_228.y + local_1b8 + -2.0;
      if (fVar23 <= fVar25) {
        fVar25 = fVar23;
      }
      uVar20 = -(uint)(fVar23 < local_228.y + 2.0);
      local_120.y = (float)(uVar20 & (uint)(local_228.y + 2.0) | ~uVar20 & (uint)fVar25);
      local_120.x = (float)(uVar18 & (uint)(local_228.x + 2.0) | ~uVar18 & (uint)fVar21);
      local_218._0_4_ = local_1b8 / 6.0;
      lVar17 = 0;
      do {
        lVar1 = lVar17 + 1;
        local_158._4_4_ = (float)(int)lVar17 * (float)local_218._0_4_ + local_228.y;
        local_158._0_4_ = local_1c8._0_4_;
        local_f8.y = (float)(int)lVar1 * (float)local_218._0_4_ + local_228.y;
        local_f8.x = (float)local_1d8._0_4_;
        ImDrawList::AddRectFilledMultiColor
                  (this,(ImVec2 *)local_158,&local_f8,(ImU32)(&local_178.x)[lVar17],
                   (ImU32)(&local_178.x)[lVar17],(ImU32)(&local_178.y)[lVar17],
                   (ImU32)(&local_178.y)[lVar17]);
        lVar17 = lVar1;
      } while (lVar1 != 6);
      _local_218 = ZEXT416((uint)(float)(int)(local_248 * local_1b8 + local_228.y + 0.5));
      p_min.y = local_228.y;
      p_min.x = (float)local_1c8._0_4_;
      p_max_02.y = local_1b8 + local_228.y;
      p_max_02.x = (float)local_1d8._0_4_;
      RenderFrameBorder(p_min,p_max_02,0.0);
      pos.x = (float)local_1c8._0_4_ + -1.0;
      pos.y = (float)local_218._0_4_;
      half_sz.x = local_78 + 1.0;
      half_sz.y = local_78;
      RenderArrowsForVerticalBar(this,pos,half_sz,local_148 + 2.0,(local_238->Style).Alpha);
      pIVar16 = local_1f0;
      uVar20 = local_240;
      IVar9 = local_19c;
    }
  }
  else {
    local_d8 = ZEXT416((uint)(0.5 / local_a8));
    iVar10 = 4;
    if (4 < (int)local_a8 / 0xc) {
      iVar10 = (int)local_a8 / 0xc;
    }
    local_88._0_4_ = iVar10;
    local_98 = -(0.5 / local_a8);
    uStack_94 = 0x80000000;
    uStack_90 = 0x80000000;
    uStack_8c = 0x80000000;
    local_a8 = local_a8 + (float)local_218._0_4_;
    local_68 = local_a8 * 0.5;
    uStack_64 = uStack_a4;
    uStack_60 = uStack_a0;
    uStack_5c = uStack_9c;
    lVar17 = 0;
    local_19c = IVar9;
    local_ec = col_upr_right;
    do {
      fVar21 = (float)(int)lVar17 / 6.0;
      fVar21 = (fVar21 + fVar21) * 3.1415927 + local_98;
      local_1d8._0_4_ = fVar21;
      fVar25 = ((float)(int)lVar17 + 1.0) / 6.0;
      fVar25 = (fVar25 + fVar25) * 3.1415927 + (float)local_d8._0_4_;
      local_138.x = fVar25;
      iVar10 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo(this,&local_1fc,local_68,fVar21,fVar25,local_88._0_4_);
      ImDrawList::AddPolyline(this,(this->_Path).Data,(this->_Path).Size,IVar7,false,local_21c);
      (this->_Path).Size = 0;
      iVar13 = (this->VtxBuffer).Size;
      local_1c8._0_4_ = local_1fc.x;
      fVar21 = cosf((float)local_1d8._0_4_);
      local_1c8._4_4_ = extraout_XMM0_Db_01;
      local_1c8._0_4_ = fVar21 * (float)local_218._0_4_ + (float)local_1c8._0_4_;
      uStack_1c0 = extraout_XMM0_Dc_01;
      uStack_1bc = extraout_XMM0_Dd_01;
      local_c8._0_4_ = local_1fc.y;
      fVar21 = sinf((float)local_1d8._0_4_);
      uStack_1c0 = local_1c8._4_4_;
      local_1c8._4_4_ = fVar21 * (float)local_218._0_4_ + (float)local_c8._0_4_;
      uStack_1bc = extraout_XMM0_Db_02;
      local_1d8 = ZEXT416((uint)local_1fc.x);
      fVar21 = cosf(local_138.x);
      local_1d8._0_4_ = (float)local_1d8._0_4_ + fVar21 * (float)local_218._0_4_;
      local_c8._0_4_ = local_1fc.y;
      fVar21 = sinf(local_138.x);
      gradient_p1.y = fVar21 * (float)local_218._0_4_ + (float)local_c8._0_4_;
      gradient_p1.x = (float)local_1d8._0_4_;
      lVar1 = lVar17 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (this,iVar10,iVar13,(ImVec2)local_1c8,gradient_p1,(ImU32)(&local_178.x)[lVar17],
                 (ImU32)(&local_178.y)[lVar17]);
      lVar17 = lVar1;
    } while (lVar1 != 6);
    fVar21 = cosf((local_248 + local_248) * 3.1415927);
    local_218._0_4_ = fVar21;
    fVar21 = sinf((local_248 + local_248) * 3.1415927);
    IVar9 = local_ec;
    IVar7 = local_1f4;
    local_1c8._0_4_ = fVar21;
    local_158._4_4_ = local_a8 * fVar21 * 0.5 + local_1fc.y;
    local_158._0_4_ = local_a8 * (float)local_218._0_4_ * 0.5 + local_1fc.x;
    if ((char)local_230 == '\0') {
      fVar21 = 0.55;
    }
    else {
      fVar21 = 0.65;
    }
    local_21c = local_21c * fVar21;
    iVar10 = 0x20;
    if ((int)(local_21c / 1.4) < 0x20) {
      iVar10 = (int)(local_21c / 1.4);
    }
    iVar13 = 9;
    if (9 < iVar10) {
      iVar13 = iVar10;
    }
    ImDrawList::AddCircleFilled(this,(ImVec2 *)local_158,local_21c,local_ec,iVar13);
    ImDrawList::AddCircle(this,(ImVec2 *)local_158,local_21c + 1.0,local_198,iVar13,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)local_158,local_21c,IVar7,iVar13,1.0);
    local_f8.x = (local_180.x * (float)local_218._0_4_ - (float)local_1c8._0_4_ * local_180.y) +
                 local_1fc.x;
    local_f8.y = local_180.x * (float)local_1c8._0_4_ + local_180.y * (float)local_218._0_4_ +
                 local_1fc.y;
    local_38.y = local_188.x * (float)local_1c8._0_4_ + local_188.y * (float)local_218._0_4_ +
                 local_1fc.y;
    local_38.x = (local_188.x * (float)local_218._0_4_ - (float)local_1c8._0_4_ * local_188.y) +
                 local_1fc.x;
    local_40.y = local_190.x * (float)local_1c8._0_4_ + (float)local_218._0_4_ * local_190.y +
                 local_1fc.y;
    local_40.x = (local_190.x * (float)local_218._0_4_ - (float)local_1c8._0_4_ * local_190.y) +
                 local_1fc.x;
    IVar22 = GetFontTexUvWhitePixel();
    uStack_210 = extraout_XMM0_Qb;
    local_218._0_4_ = IVar22.x;
    local_218._4_4_ = IVar22.y;
    ImDrawList::PrimReserve(this,6,6);
    auVar6 = _local_218;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)this->_VtxCurrentIdx;
    this->_IdxWritePtr = pIVar3 + 1;
    this->_VtxWritePtr->pos = local_f8;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar9;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar18 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar18;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar18;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_38;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar9;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar18 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar18;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar18;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar7;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar18 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar18;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar18;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_f8;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = 0;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar18 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar18;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar18;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_38;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = (ImU32)local_b0;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar18 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar18;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar18;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = 0;
    this->_VtxWritePtr = pIVar4 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    _local_218 = auVar6;
    ImDrawList::AddTriangle(this,&local_f8,&local_38,&local_40,local_198,1.5);
    fVar21 = 1.0;
    if (local_244 <= 1.0) {
      fVar21 = local_244;
    }
    fVar21 = (float)(~-(uint)(local_244 < 0.0) & (uint)fVar21);
    fVar24 = (local_f8.x - local_40.x) * fVar21 + local_40.x;
    fVar25 = (local_f8.y - local_40.y) * fVar21 + local_40.y;
    fVar23 = 1.0 - local_23c;
    fVar21 = 1.0;
    if (fVar23 <= 1.0) {
      fVar21 = fVar23;
    }
    fVar21 = (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar21);
    local_120.x = (local_38.x - fVar24) * fVar21 + fVar24;
    local_120.y = (local_38.y - fVar25) * fVar21 + fVar25;
    pIVar16 = local_1f0;
    uVar20 = local_240;
    IVar9 = local_19c;
  }
  pIVar5 = local_238;
  if ((char)local_22c == '\0') {
    fVar21 = 6.0;
  }
  else {
    fVar21 = 10.0;
  }
  local_218._0_4_ = fVar21;
  ImDrawList::AddCircleFilled(this,&local_120,fVar21,IVar9,0xc);
  ImDrawList::AddCircle(this,&local_120,(float)local_218._0_4_ + 1.0,local_198,0xc,1.0);
  ImDrawList::AddCircle(this,&local_120,(float)local_218._0_4_,local_1f4,0xc,1.0);
  if (local_194 == 0x10000) {
    fVar21 = pIVar16[1].y;
    _local_1c8 = ZEXT416((uint)fVar21);
    fVar25 = 1.0;
    if (fVar21 <= 1.0) {
      fVar25 = fVar21;
    }
    _local_218 = ZEXT416((uint)(1.0 - fVar25));
    local_158._8_4_ = local_148 + (float)local_118._0_4_;
    fStack_14c = local_1b8 + local_228.y;
    local_158._4_4_ = local_228.y;
    local_158._0_4_ = local_118._0_4_;
    p_max.y = fStack_14c;
    p_max.x = (float)local_158._8_4_;
    RenderColorRectWithAlphaCheckerboard
              (this,(ImVec2)local_158._0_8_,p_max,0,
               ((float)local_158._8_4_ - (float)local_118._0_4_) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_158,(ImVec2 *)(local_158 + 8),IVar9,IVar9,IVar9 & 0xffffff,
               IVar9 & 0xffffff);
    local_218._4_4_ = (float)(int)(float)(~local_1c8._4_4_ & local_218._4_4_);
    local_218._0_4_ =
         (float)(int)((float)(-(uint)((float)local_1c8._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_1c8._0_4_ < 0.0) & local_218._0_4_) * local_1b8 +
                      local_228.y + 0.5);
    uStack_210._0_4_ = (uint)(float)(int)(float)(~uStack_1c0 & (uint)uStack_210);
    uStack_210._4_4_ = (uint)(float)(int)(float)(~uStack_1bc & uStack_210._4_4_);
    p_max_00.y = fStack_14c;
    p_max_00.x = (float)local_158._8_4_;
    RenderFrameBorder((ImVec2)local_158._0_8_,p_max_00,0.0);
    pos_00.x = (float)local_118._0_4_ + -1.0;
    pos_00.y = (float)local_218._0_4_;
    half_sz_00.x = local_78 + 1.0;
    half_sz_00.y = local_78;
    RenderArrowsForVerticalBar(this,pos_00,half_sz_00,local_148 + 2.0,(pIVar5->Style).Alpha);
  }
  EndGroup();
  if ((char)uVar20 != '\0') {
    iVar10 = bcmp(local_58,pIVar16,local_b8);
    uVar20 = uVar20 & 0xff;
    if (iVar10 == 0) {
      uVar20 = 0;
    }
  }
  bVar14 = (byte)uVar20;
  if ((uVar20 & 1) != 0) {
    MarkItemEdited((local_100->DC).LastItemId);
  }
  PopID();
LAB_0016b80f:
  return (bool)(bVar14 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
        {
            if (S == 0)
                H = g.ColorEditLastHue;
            if (V == 0)
                S = g.ColorEditLastSat;
        }
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10 * 1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            memcpy(g.ColorEditLastColor, col, sizeof(float) * 3);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0) // Fix local Hue as display below will use it immediately.
            {
                if (S == 0)
                    H = g.ColorEditLastHue;
                if (V == 0)
                    S = g.ColorEditLastSat;
            }
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}